

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# automaton.c
# Opt level: O1

int MAFSA_automaton_val_to_int(MAFSA_letter *l,size_t sz_l,MAFSA_letter delim,int *out)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  
  uVar3 = (int)sz_l - 1;
  if ((int)uVar3 < 0) {
    iVar2 = 0;
  }
  else {
    iVar2 = 0;
    lVar4 = (ulong)uVar3 + 1;
    do {
      iVar2 = iVar2 * (uint)delim + (uint)l[lVar4 + -1];
      lVar5 = lVar4 + -1;
      bVar1 = 0 < lVar4;
      lVar4 = lVar5;
    } while (lVar5 != 0 && bVar1);
  }
  *out = iVar2;
  return 0;
}

Assistant:

extern int MAFSA_automaton_val_to_int(const MAFSA_letter *l,
    size_t sz_l, MAFSA_letter delim, int *out)
{
    int i;
    int count;

    for (i = sz_l - 1, count = 0; i >= 0; --i)
    {
        count *= delim;
        count += l[i];
    }

    out[0] = count;

    return 0;
}